

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall TypeTest_CanonicalizeFinal_Test::TestBody(TypeTest_CanonicalizeFinal_Test *this)

{
  bool bVar1;
  byte bVar2;
  Entry *this_00;
  char *pcVar3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference val1;
  reference val2;
  char *in_R9;
  Entry EVar4;
  string local_1b8;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__1;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_e8;
  AssertHelper local_c8;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Struct local_78 [2];
  Entry local_48;
  Struct local_38;
  TypeBuilder local_18;
  TypeBuilder builder;
  TypeTest_CanonicalizeFinal_Test *this_local;
  
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)this;
  ::wasm::TypeBuilder::TypeBuilder(&local_18,2);
  local_38.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(&local_38);
  local_48 = ::wasm::TypeBuilder::operator[](&local_18,0);
  ::wasm::TypeBuilder::Entry::operator=(&local_48,&local_38);
  ::wasm::Struct::~Struct(&local_38);
  local_78[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(local_78);
  EVar4 = ::wasm::TypeBuilder::operator[](&local_18,1);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar4.builder;
  this_00 = ::wasm::TypeBuilder::Entry::setOpen
                      ((Entry *)((long)&result.
                                        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                        .
                                        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                        .
                                        super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                        .
                                        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                        .
                                        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                        .
                                        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                + 0x18),true);
  ::wasm::TypeBuilder::Entry::operator=(this_00,local_78);
  ::wasm::Struct::~Struct(local_78);
  ::wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_b8,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)local_b8,(AssertionResult *)0x4945b1,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x251,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  if (bVar1) {
    __x = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,__x);
    val1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                     ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,
                      0);
    val2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                     ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,
                      1);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_118,"built[0]","built[1]",val1,val2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x254,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_120);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,0);
    bVar2 = ::wasm::HeapType::isOpen();
    local_139 = (bool)(~bVar2 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_138,&local_139,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_138,
                 (AssertionResult *)"!built[0].isOpen()","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x255,pcVar3);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,1);
    bVar2 = ::wasm::HeapType::isOpen();
    local_181 = (bool)(bVar2 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_180,&local_181,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1b8,(internal *)local_180,(AssertionResult *)"!built[1].isOpen()","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x256,pcVar3);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      testing::Message::~Message(&local_190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_);
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder(&local_18);
  return;
}

Assistant:

TEST_F(TypeTest, CanonicalizeFinal) {
  // Types are different if their finality flag is different.
  TypeBuilder builder(2);
  builder[0] = Struct{};
  builder[1].setOpen() = Struct{};

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_NE(built[0], built[1]);
  EXPECT_TRUE(!built[0].isOpen());
  EXPECT_FALSE(!built[1].isOpen());
}